

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_dec
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  int iVar1;
  long in_RDI;
  string_view sVar2;
  undefined4 unaff_retaddr;
  dec_writer in_stack_00000010;
  int num_digits;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *pcVar3;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  undefined6 uVar5;
  
  pcVar3 = *(char **)(in_RDI + 0x10);
  sVar4 = *(size_t *)(in_RDI + 0x18);
  n._8_4_ = in_stack_ffffffffffffff38;
  n._0_8_ = in_stack_ffffffffffffff30;
  n._12_4_ = in_stack_ffffffffffffff3c;
  iVar1 = count_digits((uint128_t)n);
  sVar2 = get_prefix((int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_> *)0x35107d);
  prefix.size_ = sVar4;
  prefix.data_ = pcVar3;
  specs.precision = iVar1;
  specs.width = in_stack_fffffffffffffff0;
  uVar5 = (undefined6)((ulong)in_RDI >> 0x10);
  specs.type = (char)in_RDI;
  specs._9_1_ = (char)((ulong)in_RDI >> 8);
  specs.fill.data_[0] = (char)uVar5;
  specs.fill.data_[1] = (char)((uint6)uVar5 >> 8);
  specs.fill.data_[2] = (char)((uint6)uVar5 >> 0x10);
  specs.fill.data_[3] = (char)((uint6)uVar5 >> 0x18);
  specs.fill.data_[4] = (char)((uint6)uVar5 >> 0x20);
  specs.fill.data_[5] = (char)((uint6)uVar5 >> 0x28);
  specs._16_4_ = unaff_retaddr;
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)sVar2.size_,sVar2.data_._4_4_,
             prefix,specs,in_stack_00000010);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }